

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_land_mass_2(dw_map *map,uint8_t x,uint8_t y,uint8_t lm_index)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BOOL BVar4;
  int iVar5;
  bool bVar6;
  int right;
  int left;
  int size;
  uint8_t lm_index_local;
  uint8_t y_local;
  uint8_t x_local;
  dw_map *map_local;
  
  right = 0;
  bVar1 = 0x77;
  left._3_1_ = x;
  while( true ) {
    bVar2 = left._3_1_;
    BVar4 = map_ob(left._3_1_ - 1);
    bVar6 = false;
    if (BVar4 == FALSE) {
      BVar4 = tile_is_walkable((uint)map->tiles[(int)(left._3_1_ - 1)][y]);
      bVar6 = BVar4 != FALSE;
    }
    bVar3 = left._3_1_;
    if (!bVar6) break;
    left._3_1_ = left._3_1_ - 1;
  }
  while( true ) {
    left._3_1_ = bVar3;
    BVar4 = map_ob((uint)left._3_1_);
    bVar6 = false;
    if (BVar4 == FALSE) {
      BVar4 = tile_is_walkable((uint)map->tiles[left._3_1_][y]);
      bVar6 = BVar4 != FALSE;
    }
    if (!bVar6) break;
    map->walkable[left._3_1_][y] = lm_index;
    right = right + 1;
    bVar3 = left._3_1_ + 1;
    bVar1 = left._3_1_;
  }
  while (left._3_1_ = bVar2, left._3_1_ <= bVar1) {
    BVar4 = map_ob(y - 1);
    if (((BVar4 == FALSE) &&
        (BVar4 = tile_is_walkable((uint)map->tiles[left._3_1_][(int)(y - 1)]), BVar4 != FALSE)) &&
       (map->walkable[left._3_1_][(int)(y - 1)] == '\0')) {
      iVar5 = map_land_mass_2(map,left._3_1_,y + 0xff,lm_index);
      right = iVar5 + right;
    }
    BVar4 = map_ob(y + 1);
    if (((BVar4 == FALSE) &&
        (BVar4 = tile_is_walkable((uint)map->tiles[left._3_1_][(int)(y + 1)]), BVar4 != FALSE)) &&
       (map->walkable[left._3_1_][(int)(y + 1)] == '\0')) {
      iVar5 = map_land_mass_2(map,left._3_1_,y + '\x01',lm_index);
      right = iVar5 + right;
    }
    bVar2 = left._3_1_ + 1;
  }
  return right;
}

Assistant:

static int map_land_mass_2(dw_map *map, uint8_t x, uint8_t y,
        uint8_t lm_index)
{
    int size = 0;
    int left = 0;
    int right = 119;

    /* Move all the way to the left */
    while(!map_ob(x-1) && tile_is_walkable(map->tiles[x-1][y]))
        x--;
    left = x;

    while(!map_ob(x) && tile_is_walkable(map->tiles[x][y])) {
        map->walkable[x][y] = lm_index;
        right = x++;
        size++;
    }
    /* go back to the left side and look up & down */
    for (x = left; x <= right; x++) {
        if (!map_ob(y-1) && tile_is_walkable(map->tiles[x][y-1]) &&
                !map->walkable[x][y-1])
            size += map_land_mass_2(map, x, y-1, lm_index);
        if (!map_ob(y+1) && tile_is_walkable(map->tiles[x][y+1]) &&
                !map->walkable[x][y+1])
            size += map_land_mass_2(map, x, y+1, lm_index);
    }
    return size;
}